

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QMakeParser::ParseCtx>::relocate
          (QArrayDataPointer<QMakeParser::ParseCtx> *this,qsizetype offset,ParseCtx **data)

{
  ParseCtx *d_first;
  ParseCtx *pPVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QMakeParser::ParseCtx,long_long>(this->ptr,this->size,d_first);
  if (data != (ParseCtx **)0x0) {
    pPVar1 = *data;
    if ((this->ptr <= pPVar1) && (pPVar1 < this->ptr + this->size)) {
      *data = pPVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }